

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.h
# Opt level: O2

void __thiscall CRPCCommand::CRPCCommand(CRPCCommand *this,string category,RpcMethodFnType fn)

{
  string name;
  undefined8 in_RDX;
  long in_FS_OFFSET;
  string in_stack_fffffffffffffdd8;
  undefined8 uVar1;
  code *pcVar2;
  code *pcVar3;
  string in_stack_fffffffffffffe18;
  _Vector_impl_data in_stack_fffffffffffffe38;
  RPCHelpMan local_130;
  string local_78 [32];
  string local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string
            (local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fn);
  (*(code *)in_RDX)(&local_130);
  std::__cxx11::string::string(local_78,&local_130.m_name);
  uVar1 = 0;
  pcVar3 = std::
           _Function_handler<bool_(const_JSONRPCRequest_&,_UniValue_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/server.h:107:15)>
           ::_M_invoke;
  pcVar2 = std::
           _Function_handler<bool_(const_JSONRPCRequest_&,_UniValue_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/server.h:107:15)>
           ::_M_manager;
  (*(code *)in_RDX)(&stack0xfffffffffffffe18);
  RPCHelpMan::GetArgNames_abi_cxx11_
            ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              *)&stack0xfffffffffffffde0,(RPCHelpMan *)&stack0xfffffffffffffe18);
  name._M_string_length = uVar1;
  name._M_dataplus._M_p = (pointer)in_RDX;
  name.field_2._M_allocated_capacity = (size_type)pcVar2;
  name.field_2._8_8_ = pcVar3;
  CRPCCommand(this,in_stack_fffffffffffffdd8,name,(Actor)in_stack_fffffffffffffe18,
              (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               )in_stack_fffffffffffffe38,(intptr_t)local_58);
  ::wallet::_GLOBAL__N_1::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             *)&stack0xfffffffffffffde0);
  RPCHelpMan::~RPCHelpMan((RPCHelpMan *)&stack0xfffffffffffffe18);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffdf8);
  std::__cxx11::string::~string(local_78);
  RPCHelpMan::~RPCHelpMan(&local_130);
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CRPCCommand(std::string category, RpcMethodFnType fn)
        : CRPCCommand(
              category,
              fn().m_name,
              [fn](const JSONRPCRequest& request, UniValue& result, bool) { result = fn().HandleRequest(request); return true; },
              fn().GetArgNames(),
              intptr_t(fn))
    {
    }